

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

void __thiscall xmrig::CpuConfig::setMemoryPool(CpuConfig *this,Value *value)

{
  ushort uVar1;
  SizeType SVar2;
  
  uVar1 = (value->data_).f.flags;
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 0x20) == 0) {
      return;
    }
    SVar2 = (value->data_).s.length;
  }
  else {
    SVar2 = -(uint)(uVar1 == 10);
  }
  this->m_memoryPool = SVar2;
  return;
}

Assistant:

bool IsBool()   const { return (data_.f.flags & kBoolFlag) != 0; }